

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O0

int mbedtls_cipher_update
              (mbedtls_cipher_context_t *ctx,uchar *input,size_t ilen,uchar *output,size_t *olen)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  size_t __n;
  size_t local_50;
  size_t copy_len;
  size_t block_size;
  int ret;
  size_t *olen_local;
  uchar *output_local;
  size_t ilen_local;
  uchar *input_local;
  mbedtls_cipher_context_t *ctx_local;
  
  if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
    ctx_local._4_4_ = -0x6100;
  }
  else {
    *olen = 0;
    uVar1 = mbedtls_cipher_get_block_size(ctx);
    uVar3 = (ulong)uVar1;
    if (uVar3 == 0) {
      ctx_local._4_4_ = -0x6380;
    }
    else if (ctx->cipher_info->mode == MBEDTLS_MODE_ECB) {
      if (ilen == uVar3) {
        *olen = ilen;
        ctx_local._4_4_ =
             (*ctx->cipher_info->base->ecb_func)(ctx->cipher_ctx,ctx->operation,input,output);
        if (ctx_local._4_4_ == 0) {
          ctx_local._4_4_ = 0;
        }
      }
      else {
        ctx_local._4_4_ = -0x6280;
      }
    }
    else if (ctx->cipher_info->mode == MBEDTLS_MODE_GCM) {
      *olen = ilen;
      ctx_local._4_4_ = mbedtls_gcm_update((mbedtls_gcm_context *)ctx->cipher_ctx,ilen,input,output)
      ;
    }
    else if (ctx->cipher_info->type == MBEDTLS_CIPHER_CHACHA20_POLY1305) {
      *olen = ilen;
      ctx_local._4_4_ =
           mbedtls_chachapoly_update
                     ((mbedtls_chachapoly_context *)ctx->cipher_ctx,ilen,input,output);
    }
    else if ((input == output) && ((ctx->unprocessed_len != 0 || (ilen % uVar3 != 0)))) {
      ctx_local._4_4_ = -0x6100;
    }
    else if (ctx->cipher_info->mode == MBEDTLS_MODE_CBC) {
      if ((((ctx->operation == MBEDTLS_DECRYPT) &&
           (ctx->add_padding != (_func_void_uchar_ptr_size_t_size_t *)0x0)) &&
          (ilen <= uVar3 - ctx->unprocessed_len)) ||
         ((((ctx->operation == MBEDTLS_DECRYPT &&
            (ctx->add_padding == (_func_void_uchar_ptr_size_t_size_t *)0x0)) &&
           (ilen < uVar3 - ctx->unprocessed_len)) ||
          ((ctx->operation == MBEDTLS_ENCRYPT && (ilen < uVar3 - ctx->unprocessed_len)))))) {
        memcpy(ctx->unprocessed_data + ctx->unprocessed_len,input,ilen);
        ctx->unprocessed_len = ilen + ctx->unprocessed_len;
        ctx_local._4_4_ = 0;
      }
      else {
        olen_local = (size_t *)output;
        output_local = (uchar *)ilen;
        ilen_local = (size_t)input;
        if (ctx->unprocessed_len != 0) {
          __n = uVar3 - ctx->unprocessed_len;
          memcpy(ctx->unprocessed_data + ctx->unprocessed_len,input,__n);
          iVar2 = (*ctx->cipher_info->base->cbc_func)
                            (ctx->cipher_ctx,ctx->operation,uVar3,ctx->iv,ctx->unprocessed_data,
                             output);
          if (iVar2 != 0) {
            return iVar2;
          }
          *olen = uVar3 + *olen;
          olen_local = (size_t *)(output + uVar3);
          ctx->unprocessed_len = 0;
          ilen_local = (size_t)(input + __n);
          output_local = (uchar *)(ilen - __n);
        }
        if (output_local != (uchar *)0x0) {
          local_50 = (ulong)output_local % uVar3;
          if (((local_50 == 0) && (ctx->operation == MBEDTLS_DECRYPT)) &&
             (ctx->add_padding != (_func_void_uchar_ptr_size_t_size_t *)0x0)) {
            local_50 = uVar3;
          }
          memcpy(ctx->unprocessed_data,output_local + (ilen_local - local_50),local_50);
          ctx->unprocessed_len = local_50 + ctx->unprocessed_len;
          output_local = output_local + -local_50;
        }
        if (output_local != (uchar *)0x0) {
          iVar2 = (*ctx->cipher_info->base->cbc_func)
                            (ctx->cipher_ctx,ctx->operation,(size_t)output_local,ctx->iv,
                             (uchar *)ilen_local,(uchar *)olen_local);
          if (iVar2 != 0) {
            return iVar2;
          }
          *olen = (size_t)(output_local + *olen);
        }
        ctx_local._4_4_ = 0;
      }
    }
    else if (ctx->cipher_info->mode == MBEDTLS_MODE_CFB) {
      ctx_local._4_4_ =
           (*ctx->cipher_info->base->cfb_func)
                     (ctx->cipher_ctx,ctx->operation,ilen,&ctx->unprocessed_len,ctx->iv,input,output
                     );
      if (ctx_local._4_4_ == 0) {
        *olen = ilen;
        ctx_local._4_4_ = 0;
      }
    }
    else if (ctx->cipher_info->mode == MBEDTLS_MODE_OFB) {
      ctx_local._4_4_ =
           (*ctx->cipher_info->base->ofb_func)
                     (ctx->cipher_ctx,ilen,&ctx->unprocessed_len,ctx->iv,input,output);
      if (ctx_local._4_4_ == 0) {
        *olen = ilen;
        ctx_local._4_4_ = 0;
      }
    }
    else if (ctx->cipher_info->mode == MBEDTLS_MODE_CTR) {
      ctx_local._4_4_ =
           (*ctx->cipher_info->base->ctr_func)
                     (ctx->cipher_ctx,ilen,&ctx->unprocessed_len,ctx->iv,ctx->unprocessed_data,input
                      ,output);
      if (ctx_local._4_4_ == 0) {
        *olen = ilen;
        ctx_local._4_4_ = 0;
      }
    }
    else if (ctx->cipher_info->mode == MBEDTLS_MODE_XTS) {
      if (ctx->unprocessed_len == 0) {
        ctx_local._4_4_ =
             (*ctx->cipher_info->base->xts_func)
                       (ctx->cipher_ctx,ctx->operation,ilen,ctx->iv,input,output);
        if (ctx_local._4_4_ == 0) {
          *olen = ilen;
          ctx_local._4_4_ = 0;
        }
      }
      else {
        ctx_local._4_4_ = -0x6080;
      }
    }
    else if (ctx->cipher_info->mode == MBEDTLS_MODE_STREAM) {
      ctx_local._4_4_ = (*ctx->cipher_info->base->stream_func)(ctx->cipher_ctx,ilen,input,output);
      if (ctx_local._4_4_ == 0) {
        *olen = ilen;
        ctx_local._4_4_ = 0;
      }
    }
    else {
      ctx_local._4_4_ = -0x6080;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_cipher_update( mbedtls_cipher_context_t *ctx, const unsigned char *input,
                   size_t ilen, unsigned char *output, size_t *olen )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t block_size;

    CIPHER_VALIDATE_RET( ctx != NULL );
    CIPHER_VALIDATE_RET( ilen == 0 || input != NULL );
    CIPHER_VALIDATE_RET( output != NULL );
    CIPHER_VALIDATE_RET( olen != NULL );
    if( ctx->cipher_info == NULL )
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );

#if defined(MBEDTLS_USE_PSA_CRYPTO)
    if( ctx->psa_enabled == 1 )
    {
        /* While PSA Crypto has an API for multipart
         * operations, we currently don't make it
         * accessible through the cipher layer. */
        return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO */

    *olen = 0;
    block_size = mbedtls_cipher_get_block_size( ctx );
    if ( 0 == block_size )
    {
        return( MBEDTLS_ERR_CIPHER_INVALID_CONTEXT );
    }

    if( ctx->cipher_info->mode == MBEDTLS_MODE_ECB )
    {
        if( ilen != block_size )
            return( MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED );

        *olen = ilen;

        if( 0 != ( ret = ctx->cipher_info->base->ecb_func( ctx->cipher_ctx,
                    ctx->operation, input, output ) ) )
        {
            return( ret );
        }

        return( 0 );
    }

#if defined(MBEDTLS_GCM_C)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_GCM )
    {
        *olen = ilen;
        return( mbedtls_gcm_update( (mbedtls_gcm_context *) ctx->cipher_ctx, ilen, input,
                                    output ) );
    }
#endif

#if defined(MBEDTLS_CHACHAPOLY_C)
    if ( ctx->cipher_info->type == MBEDTLS_CIPHER_CHACHA20_POLY1305 )
    {
        *olen = ilen;
        return( mbedtls_chachapoly_update( (mbedtls_chachapoly_context*) ctx->cipher_ctx,
                                           ilen, input, output ) );
    }
#endif

    if( input == output &&
       ( ctx->unprocessed_len != 0 || ilen % block_size ) )
    {
        return( MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA );
    }

#if defined(MBEDTLS_CIPHER_MODE_CBC)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_CBC )
    {
        size_t copy_len = 0;

        /*
         * If there is not enough data for a full block, cache it.
         */
        if( ( ctx->operation == MBEDTLS_DECRYPT && NULL != ctx->add_padding &&
                ilen <= block_size - ctx->unprocessed_len ) ||
            ( ctx->operation == MBEDTLS_DECRYPT && NULL == ctx->add_padding &&
                ilen < block_size - ctx->unprocessed_len ) ||
             ( ctx->operation == MBEDTLS_ENCRYPT &&
                ilen < block_size - ctx->unprocessed_len ) )
        {
            memcpy( &( ctx->unprocessed_data[ctx->unprocessed_len] ), input,
                    ilen );

            ctx->unprocessed_len += ilen;
            return( 0 );
        }

        /*
         * Process cached data first
         */
        if( 0 != ctx->unprocessed_len )
        {
            copy_len = block_size - ctx->unprocessed_len;

            memcpy( &( ctx->unprocessed_data[ctx->unprocessed_len] ), input,
                    copy_len );

            if( 0 != ( ret = ctx->cipher_info->base->cbc_func( ctx->cipher_ctx,
                    ctx->operation, block_size, ctx->iv,
                    ctx->unprocessed_data, output ) ) )
            {
                return( ret );
            }

            *olen += block_size;
            output += block_size;
            ctx->unprocessed_len = 0;

            input += copy_len;
            ilen -= copy_len;
        }

        /*
         * Cache final, incomplete block
         */
        if( 0 != ilen )
        {
            /* Encryption: only cache partial blocks
             * Decryption w/ padding: always keep at least one whole block
             * Decryption w/o padding: only cache partial blocks
             */
            copy_len = ilen % block_size;
            if( copy_len == 0 &&
                ctx->operation == MBEDTLS_DECRYPT &&
                NULL != ctx->add_padding)
            {
                copy_len = block_size;
            }

            memcpy( ctx->unprocessed_data, &( input[ilen - copy_len] ),
                    copy_len );

            ctx->unprocessed_len += copy_len;
            ilen -= copy_len;
        }

        /*
         * Process remaining full blocks
         */
        if( ilen )
        {
            if( 0 != ( ret = ctx->cipher_info->base->cbc_func( ctx->cipher_ctx,
                    ctx->operation, ilen, ctx->iv, input, output ) ) )
            {
                return( ret );
            }

            *olen += ilen;
        }

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_CBC */

#if defined(MBEDTLS_CIPHER_MODE_CFB)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_CFB )
    {
        if( 0 != ( ret = ctx->cipher_info->base->cfb_func( ctx->cipher_ctx,
                ctx->operation, ilen, &ctx->unprocessed_len, ctx->iv,
                input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_CFB */

#if defined(MBEDTLS_CIPHER_MODE_OFB)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_OFB )
    {
        if( 0 != ( ret = ctx->cipher_info->base->ofb_func( ctx->cipher_ctx,
                ilen, &ctx->unprocessed_len, ctx->iv, input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_OFB */

#if defined(MBEDTLS_CIPHER_MODE_CTR)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_CTR )
    {
        if( 0 != ( ret = ctx->cipher_info->base->ctr_func( ctx->cipher_ctx,
                ilen, &ctx->unprocessed_len, ctx->iv,
                ctx->unprocessed_data, input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_CTR */

#if defined(MBEDTLS_CIPHER_MODE_XTS)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_XTS )
    {
        if( ctx->unprocessed_len > 0 ) {
            /* We can only process an entire data unit at a time. */
            return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
        }

        ret = ctx->cipher_info->base->xts_func( ctx->cipher_ctx,
                ctx->operation, ilen, ctx->iv, input, output );
        if( ret != 0 )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_XTS */

#if defined(MBEDTLS_CIPHER_MODE_STREAM)
    if( ctx->cipher_info->mode == MBEDTLS_MODE_STREAM )
    {
        if( 0 != ( ret = ctx->cipher_info->base->stream_func( ctx->cipher_ctx,
                                                    ilen, input, output ) ) )
        {
            return( ret );
        }

        *olen = ilen;

        return( 0 );
    }
#endif /* MBEDTLS_CIPHER_MODE_STREAM */

    return( MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE );
}